

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MethodPrototypeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::SubroutineKind&,slang::ast::Visibility&,slang::bitmask<slang::ast::MethodFlags>&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          SubroutineKind *args_3,Visibility *args_4,bitmask<slang::ast::MethodFlags> *args_5)

{
  string_view name;
  MethodPrototypeSymbol *this_00;
  
  this_00 = (MethodPrototypeSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MethodPrototypeSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (MethodPrototypeSymbol *)allocateSlow(this,0x100,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  ast::MethodPrototypeSymbol::MethodPrototypeSymbol
            (this_00,args,name,*args_2,*args_3,*args_4,
             (bitmask<slang::ast::MethodFlags>)args_5->m_bits);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }